

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  unsigned_long_long uVar4;
  void *src_00;
  bool bVar5;
  ZSTD_frameSizeInfo ZVar6;
  size_t sStack_70;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
      sStack_70 = 0xffffffffffffffb8;
      if (uVar2 <= srcSize) {
        sStack_70 = uVar2;
      }
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      sStack_70 = 0xfffffffffffffff2;
    }
    goto LAB_00136aa6;
  }
  sStack_70 = ZSTD_getFrameHeader(&zfh,src,srcSize);
  uVar4 = 0xfffffffffffffffe;
  if (0xffffffffffffff88 < sStack_70) goto LAB_00136aa6;
  if (sStack_70 == 0) {
    src_00 = (void *)((long)src + (ulong)zfh.headerSize);
    uVar2 = srcSize - zfh.headerSize;
    lVar3 = 0;
    do {
      sStack_70 = ZSTD_getcBlockSize(src_00,uVar2,&blockProperties);
      if (0xffffffffffffff88 < sStack_70) goto LAB_00136aa6;
      uVar1 = sStack_70 + 3;
      bVar5 = uVar2 < uVar1;
      uVar2 = uVar2 - uVar1;
      sStack_70 = 0xffffffffffffffb8;
      if (bVar5) goto LAB_00136aa6;
      src_00 = (void *)((long)src_00 + uVar1);
      lVar3 = lVar3 + 1;
    } while (blockProperties.lastBlock == 0);
    if (zfh.checksumFlag != 0) {
      if (uVar2 < 4) goto LAB_00136a19;
      src_00 = (void *)((long)src_00 + 4);
    }
    sStack_70 = (long)src_00 - (long)src;
    uVar4 = lVar3 * (ulong)zfh.blockSizeMax;
    if (zfh.frameContentSize != 0xffffffffffffffff) {
      uVar4 = zfh.frameContentSize;
    }
  }
  else {
LAB_00136a19:
    sStack_70 = 0xffffffffffffffb8;
  }
LAB_00136aa6:
  ZVar6.decompressedBound = uVar4;
  ZVar6.compressedSize = sStack_70;
  return ZVar6;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = ip - ipstart;
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}